

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

size_t cs_disasm(csh ud,uint8_t *buffer,size_t size,uint64_t offset,size_t count,cs_insn **insn)

{
  cs_skipdata_cb_t p_Var1;
  ulong uVar2;
  cs_insn *pcVar3;
  cs_struct *pcVar4;
  long lVar5;
  _Bool _Var6;
  cs_insn *pcVar7;
  cs_detail *pcVar8;
  size_t __n;
  cs_insn *pcVar9;
  uint uVar10;
  uint8_t *buffer_00;
  size_t sVar11;
  cs_detail **ppcVar12;
  size_t sVar13;
  cs_insn **ppcVar14;
  bool bVar15;
  uint16_t insn_size;
  ulong local_5e0;
  cs_insn *local_5d8;
  ulong local_5d0;
  cs_insn **local_5c8;
  uint8_t *local_5c0;
  size_t local_5b8;
  size_t local_5b0;
  cs_struct *local_5a8;
  uint8_t *local_5a0;
  size_t local_598;
  size_t local_590;
  long local_588;
  uint64_t local_580;
  uint64_t local_578;
  ulong local_570;
  MCInst mci;
  SStream ss;
  
  if (ud != 0) {
    *(undefined4 *)(ud + 0x58) = 0;
    local_5e0 = 0x20;
    if (count - 1 < 0x20) {
      local_5e0 = count & 0xffffffff;
    }
    local_5b8 = local_5e0 * 0xf0;
    local_5a0 = buffer;
    local_598 = size;
    pcVar7 = (cs_insn *)(*cs_mem_malloc)(local_5b8);
    if (pcVar7 != (cs_insn *)0x0) {
      local_5d0 = 0;
      local_5b0 = 1;
      local_588 = 0xf0;
      local_5c0 = local_5a0;
      sVar13 = local_598;
      local_5d8 = pcVar7;
      local_5c8 = insn;
      local_5a8 = (cs_struct *)ud;
      local_590 = count;
      local_578 = offset;
      while (sVar13 != 0) {
        MCInst_Init(&mci);
        mci.address = offset;
        mci.csh = (cs_struct *)ud;
        if (((cs_struct *)ud)->detail == CS_OPT_OFF) {
          pcVar8 = (cs_detail *)0x0;
        }
        else {
          pcVar8 = (cs_detail *)(*cs_mem_malloc)(0x5f8);
        }
        buffer_00 = local_5c0;
        pcVar7->detail = pcVar8;
        pcVar7->address = offset;
        mci.flat_insn = pcVar7;
        _Var6 = (*((cs_struct *)ud)->disasm)
                          (ud,local_5c0,sVar13,&mci,&insn_size,offset,
                           ((cs_struct *)ud)->getinsn_info);
        local_580 = offset;
        local_570 = sVar13;
        if (_Var6) {
          SStream_Init(&ss);
          (mci.flat_insn)->size = insn_size;
          (*((cs_struct *)ud)->insn_id)((cs_struct *)ud,pcVar7,mci.Opcode);
          (*((cs_struct *)ud)->printer)(&mci,&ss,((cs_struct *)ud)->printer_info);
          offset = local_580;
          fill_insn((cs_struct *)ud,pcVar7,ss.buffer,&mci,((cs_struct *)ud)->post_printer,buffer_00)
          ;
          __n = (size_t)insn_size;
        }
        else {
          if (((cs_struct *)ud)->detail != CS_OPT_OFF) {
            (*cs_mem_free)(pcVar7->detail);
          }
          if (((((cs_struct *)ud)->skipdata != true) ||
              (__n = (size_t)((cs_struct *)ud)->skipdata_size, sVar13 < __n)) ||
             ((p_Var1 = (((cs_struct *)ud)->skipdata_setup).callback,
              p_Var1 != (cs_skipdata_cb_t)0x0 &&
              (__n = (*p_Var1)(local_5a0,local_598,offset - local_578,
                               (((cs_struct *)ud)->skipdata_setup).user_data), sVar13 <= __n - 1))))
          break;
          buffer_00 = local_5c0;
          pcVar7->id = 0;
          pcVar7->address = offset;
          pcVar7->size = (uint16_t)__n;
          memcpy(pcVar7->bytes,local_5c0,__n);
          strncpy(pcVar7->mnemonic,(((cs_struct *)ud)->skipdata_setup).mnemonic,0x1f);
          skipdata_opstr(pcVar7->op_str,buffer_00,__n);
          pcVar7->detail = (cs_detail *)0x0;
        }
        lVar5 = local_588;
        sVar13 = local_5b0;
        pcVar3 = local_5d8;
        uVar10 = (int)local_5d0 + 1;
        local_5d0 = (ulong)uVar10;
        sVar11 = local_590;
        if (local_590 != 0 && local_590 == local_5b0) goto LAB_00144c83;
        if (uVar10 == (uint)local_5e0) {
          uVar2 = (ulong)((uint)local_5e0 << 3) / 5;
          sVar11 = uVar2 * 0xf0 + local_5b8;
          pcVar9 = (cs_insn *)(*cs_mem_realloc)(local_5d8,sVar11);
          pcVar4 = local_5a8;
          ppcVar14 = local_5c8;
          if (pcVar9 == (cs_insn *)0x0) {
            if (local_5a8->detail != CS_OPT_OFF) {
              ppcVar12 = &pcVar3->detail;
              while (bVar15 = sVar13 != 0, sVar13 = sVar13 - 1, bVar15) {
                (*cs_mem_free)(*ppcVar12);
                ppcVar12 = ppcVar12 + 0x1e;
              }
            }
            (*cs_mem_free)(pcVar3);
            *ppcVar14 = (cs_insn *)0x0;
            pcVar4->errnum = CS_ERR_MEM;
            return 0;
          }
          pcVar7 = (cs_insn *)(pcVar9->bytes + lVar5 + -0x12);
          local_5d0 = 0;
          buffer_00 = local_5c0;
          offset = local_580;
          ud = (csh)local_5a8;
          local_5e0 = uVar2;
          local_5d8 = pcVar9;
          local_5b8 = sVar11;
        }
        else {
          pcVar7 = pcVar7 + 1;
        }
        local_5c0 = buffer_00 + __n;
        offset = offset + __n;
        local_5b0 = sVar13 + 1;
        local_588 = local_588 + 0xf0;
        sVar13 = local_570 - __n;
      }
      if (local_5b0 == 1) {
        (*cs_mem_free)(local_5d8);
        sVar11 = 0;
        pcVar7 = (cs_insn *)0x0;
        ppcVar14 = local_5c8;
LAB_00144cbb:
        *ppcVar14 = pcVar7;
        return sVar11;
      }
      sVar11 = local_5b0 - 1;
LAB_00144c83:
      ppcVar14 = local_5c8;
      pcVar3 = local_5d8;
      uVar10 = (int)local_5e0 - (int)local_5d0;
      local_5e0 = (ulong)uVar10;
      pcVar7 = local_5d8;
      if ((uVar10 == 0) ||
         (pcVar7 = (cs_insn *)(*cs_mem_realloc)(local_5d8,local_5e0 * -0xf0 + local_5b8),
         pcVar7 != (cs_insn *)0x0)) goto LAB_00144cbb;
      if (((cs_struct *)ud)->detail != CS_OPT_OFF) {
        ppcVar12 = &pcVar3->detail;
        while (bVar15 = sVar11 != 0, sVar11 = sVar11 - 1, bVar15) {
          (*cs_mem_free)(*ppcVar12);
          ppcVar12 = ppcVar12 + 0x1e;
        }
      }
      (*cs_mem_free)(pcVar3);
      *ppcVar14 = (cs_insn *)0x0;
    }
    ((cs_struct *)ud)->errnum = CS_ERR_MEM;
  }
  return 0;
}

Assistant:

CAPSTONE_EXPORT
size_t cs_disasm(csh ud, const uint8_t *buffer, size_t size, uint64_t offset, size_t count, cs_insn **insn)
{
	struct cs_struct *handle;
	MCInst mci;
	uint16_t insn_size;
	size_t c = 0, i;
	unsigned int f = 0;	// index of the next instruction in the cache
	cs_insn *insn_cache;	// cache contains disassembled instructions
	void *total = NULL;
	size_t total_size = 0;	// total size of output buffer containing all insns
	bool r;
	void *tmp;
	size_t skipdata_bytes;
	uint64_t offset_org; // save all the original info of the buffer
	size_t size_org;
	const uint8_t *buffer_org;
	unsigned int cache_size = INSN_CACHE_SIZE;
	size_t next_offset;

	handle = (struct cs_struct *)(uintptr_t)ud;
	if (!handle) {
		// FIXME: how to handle this case:
		// handle->errnum = CS_ERR_HANDLE;
		return 0;
	}

	handle->errnum = CS_ERR_OK;

#ifdef CAPSTONE_USE_SYS_DYN_MEM
	if (count > 0 && count <= INSN_CACHE_SIZE)
		cache_size = (unsigned int) count;
#endif

	// save the original offset for SKIPDATA
	buffer_org = buffer;
	offset_org = offset;
	size_org = size;

	total_size = sizeof(cs_insn) * cache_size;
	total = cs_mem_malloc(total_size);
	if (total == NULL) {
		// insufficient memory
		handle->errnum = CS_ERR_MEM;
		return 0;
	}

	insn_cache = total;

	while (size > 0) {
		MCInst_Init(&mci);
		mci.csh = handle;

		// relative branches need to know the address & size of current insn
		mci.address = offset;

		if (handle->detail) {
			// allocate memory for @detail pointer
			insn_cache->detail = cs_mem_malloc(sizeof(cs_detail));
		} else {
			insn_cache->detail = NULL;
		}

		// save all the information for non-detailed mode
		mci.flat_insn = insn_cache;
		mci.flat_insn->address = offset;
#ifdef CAPSTONE_DIET
		// zero out mnemonic & op_str
		mci.flat_insn->mnemonic[0] = '\0';
		mci.flat_insn->op_str[0] = '\0';
#endif

		r = handle->disasm(ud, buffer, size, &mci, &insn_size, offset, handle->getinsn_info);
		if (r) {
			SStream ss;
			SStream_Init(&ss);

			mci.flat_insn->size = insn_size;

			// map internal instruction opcode to public insn ID
			handle->insn_id(handle, insn_cache, mci.Opcode);

			handle->printer(&mci, &ss, handle->printer_info);

			fill_insn(handle, insn_cache, ss.buffer, &mci, handle->post_printer, buffer);

			next_offset = insn_size;
		} else	{
			// encounter a broken instruction

			// free memory of @detail pointer
			if (handle->detail) {
				cs_mem_free(insn_cache->detail);
			}

			// if there is no request to skip data, or remaining data is too small,
			// then bail out
			if (!handle->skipdata || handle->skipdata_size > size)
				break;

			if (handle->skipdata_setup.callback) {
				skipdata_bytes = handle->skipdata_setup.callback(buffer_org, size_org,
						(size_t)(offset - offset_org), handle->skipdata_setup.user_data);
				if (skipdata_bytes > size)
					// remaining data is not enough
					break;

				if (!skipdata_bytes)
					// user requested not to skip data, so bail out
					break;
			} else
				skipdata_bytes = handle->skipdata_size;

			// we have to skip some amount of data, depending on arch & mode
			insn_cache->id = 0;	// invalid ID for this "data" instruction
			insn_cache->address = offset;
			insn_cache->size = (uint16_t)skipdata_bytes;
			memcpy(insn_cache->bytes, buffer, skipdata_bytes);
			strncpy(insn_cache->mnemonic, handle->skipdata_setup.mnemonic,
					sizeof(insn_cache->mnemonic) - 1);
			skipdata_opstr(insn_cache->op_str, buffer, skipdata_bytes);
			insn_cache->detail = NULL;

			next_offset = skipdata_bytes;
		}

		// one more instruction entering the cache
		f++;

		// one more instruction disassembled
		c++;
		if (count > 0 && c == count)
			// already got requested number of instructions
			break;

		if (f == cache_size) {
			// full cache, so expand the cache to contain incoming insns
			cache_size = cache_size * 8 / 5; // * 1.6 ~ golden ratio
			total_size += (sizeof(cs_insn) * cache_size);
			tmp = cs_mem_realloc(total, total_size);
			if (tmp == NULL) {	// insufficient memory
				if (handle->detail) {
					insn_cache = (cs_insn *)total;
					for (i = 0; i < c; i++, insn_cache++)
						cs_mem_free(insn_cache->detail);
				}

				cs_mem_free(total);
				*insn = NULL;
				handle->errnum = CS_ERR_MEM;
				return 0;
			}

			total = tmp;
			// continue to fill in the cache after the last instruction
			insn_cache = (cs_insn *)((char *)total + sizeof(cs_insn) * c);

			// reset f back to 0, so we fill in the cache from begining
			f = 0;
		} else
			insn_cache++;

		buffer += next_offset;
		size -= next_offset;
		offset += next_offset;
	}

	if (!c) {
		// we did not disassemble any instruction
		cs_mem_free(total);
		total = NULL;
	} else if (f != cache_size) {
		// total did not fully use the last cache, so downsize it
		void *tmp = cs_mem_realloc(total, total_size - (cache_size - f) * sizeof(*insn_cache));
		if (tmp == NULL) {	// insufficient memory
			// free all detail pointers
			if (handle->detail) {
				insn_cache = (cs_insn *)total;
				for (i = 0; i < c; i++, insn_cache++)
					cs_mem_free(insn_cache->detail);
			}

			cs_mem_free(total);
			*insn = NULL;

			handle->errnum = CS_ERR_MEM;
			return 0;
		}

		total = tmp;
	}

	*insn = total;

	return c;
}